

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::visitBlock
          (SimplifyLocals<true,_true,_true> *this,Block *curr)

{
  Name *__k;
  mapped_type *pmVar1;
  size_type sVar2;
  bool bVar3;
  
  __k = &curr->name;
  if ((curr->name).super_IString.str._M_str == (char *)0x0) {
    bVar3 = false;
  }
  else {
    pmVar1 = std::
             map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
             ::operator[](&this->blockBreaks,__k);
    bVar3 = (pmVar1->
            super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
            )._M_impl.super__Vector_impl_data._M_finish !=
            (pmVar1->
            super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
            )._M_impl.super__Vector_impl_data._M_start;
  }
  optimizeBlockReturn(this,curr);
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    sVar2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                      (&this->unoptimizableBlocks,__k);
    if (sVar2 != 0) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
      ::clear(&(this->sinkables)._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::erase(&(this->unoptimizableBlocks)._M_t,__k);
    }
    if (bVar3) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
      ::clear(&(this->sinkables)._M_t);
      std::
      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
      ::erase(&(this->blockBreaks)._M_t,__k);
      return;
    }
  }
  return;
}

Assistant:

void visitBlock(Block* curr) {
    bool hasBreaks = curr->name.is() && blockBreaks[curr->name].size() > 0;

    if (allowStructure) {
      optimizeBlockReturn(curr); // can modify blockBreaks
    }

    // post-block cleanups
    if (curr->name.is()) {
      if (unoptimizableBlocks.count(curr->name)) {
        sinkables.clear();
        unoptimizableBlocks.erase(curr->name);
      }

      if (hasBreaks) {
        // more than one path to here, so nonlinear
        sinkables.clear();
        blockBreaks.erase(curr->name);
      }
    }
  }